

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

tmbchar ParseTagName(TidyDocImpl *doc)

{
  byte bVar1;
  int iVar2;
  Lexer *lexer;
  uint c;
  Bool BVar3;
  ulong uVar4;
  
  lexer = doc->lexer;
  iVar2 = *(int *)((doc->config).value + 0x67);
  if (iVar2 == 0) {
    bVar1 = lexer->lexbuf[lexer->txtstart];
    if ((-1 < (char)bVar1) && ((lexmap[bVar1] & 0x40) != 0)) {
      lexer->lexbuf[lexer->txtstart] = bVar1 + 0x20;
    }
  }
  c = prvTidyReadChar(doc->docIn);
  if (c == 0xffffffff) {
    uVar4 = 0xff;
  }
  else {
    do {
      uVar4 = (ulong)c;
      if (iVar2 == 0) {
        if ((0x7f < c) || ((lexmap[uVar4] & 4) == 0)) goto LAB_00149615;
        c = c + (lexmap[uVar4] >> 1 & 0x20);
      }
      else {
        BVar3 = prvTidyIsXMLNamechar(c);
        if (BVar3 == no) goto LAB_00149615;
      }
      prvTidyAddCharToLexer(lexer,c);
      c = prvTidyReadChar(doc->docIn);
    } while (c != 0xffffffff);
    uVar4 = 0xffffffff;
  }
LAB_00149615:
  lexer->txtend = lexer->lexsize;
  return (tmbchar)uVar4;
}

Assistant:

static tmbchar ParseTagName( TidyDocImpl* doc )
{
    Lexer *lexer = doc->lexer;
    uint c = lexer->lexbuf[ lexer->txtstart ];
    Bool xml = cfgBool(doc, TidyXmlTags);

    /* fold case of first character in buffer */
    if (!xml && TY_(IsUpper)(c))
        lexer->lexbuf[lexer->txtstart] = (tmbchar) TY_(ToLower)(c);

    while ((c = TY_(ReadChar)(doc->docIn)) != EndOfStream)
    {
        if ((!xml && !TY_(IsNamechar)(c)) ||
            (xml && !TY_(IsXMLNamechar)(c)))
            break;

        /* fold case of subsequent characters */
        if (!xml && TY_(IsUpper)(c))
             c = TY_(ToLower)(c);

        TY_(AddCharToLexer)(lexer, c);
    }

    lexer->txtend = lexer->lexsize;
    return (tmbchar) c;
}